

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdshemu.c
# Opt level: O1

SHEMU_STATUS ShemuMemFetch(SHEMU_CONTEXT *Context,ND_UINT64 Gla,ND_UINT64 Size,ND_UINT8 *Bytes)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ND_BOOL NVar4;
  ND_SIZET index;
  long lVar5;
  ND_UINT64 NVar6;
  ulong uVar7;
  SHEMU_ICACHE *pSVar8;
  
  if (Size - 0x101 < 0xffffffffffffff00) {
    return 7;
  }
  uVar7 = Context->ShellcodeBase;
  lVar5 = Gla - uVar7;
  if (Gla < uVar7) {
    return 2;
  }
  uVar1 = Context->ShellcodeSize + uVar7;
  if (uVar1 <= Gla) {
    return 2;
  }
  uVar2 = Size + Gla;
  if ((Context->ShellcodeSize < Size || uVar2 <= uVar7) || uVar1 < uVar2) {
    return 2;
  }
  if ((Context->Options & 0x20) == 0) {
    pSVar8 = (SHEMU_ICACHE *)Context->Shellcode;
    goto LAB_001654db;
  }
  uVar7 = (Context->Icache).Address;
  if (Gla < uVar7) {
LAB_00165581:
    (Context->Icache).Address = Gla;
    uVar7 = Context->ShellcodeSize - lVar5;
    if (0xff < uVar7) {
      uVar7 = 0x100;
    }
    (Context->Icache).Size = uVar7;
    if (uVar7 < Size) {
      return 2;
    }
    if (Context->AccessShellcode == (ShemuMemAccess)0x0) {
      return 0xf;
    }
    NVar4 = (*Context->AccessShellcode)(Context,Gla,uVar7,(Context->Icache).Icache,'\0');
    if (NVar4 == '\0') {
      return 0xf;
    }
  }
  else {
    NVar6 = (Context->Icache).Size;
    uVar1 = NVar6 + uVar7;
    if (((uVar1 <= Gla) || ((NVar6 == 0 || Gla + 1 <= uVar7) || uVar1 < Gla + 1)) ||
       (uVar1 = (Size - 1) + Gla, uVar1 < uVar7)) goto LAB_00165581;
    NVar6 = (Context->Icache).Size;
    uVar3 = NVar6 + uVar7;
    if ((uVar3 <= uVar1) || ((uVar3 < uVar2 || uVar2 <= uVar7) || NVar6 == 0)) goto LAB_00165581;
  }
  lVar5 = Gla - (Context->Icache).Address;
  pSVar8 = &Context->Icache;
LAB_001654db:
  if (((Size != 0) && (Bytes != (ND_UINT8 *)0x0)) && (pSVar8->Icache + lVar5 != (ND_UINT8 *)0x0)) {
    NVar6 = 0;
    do {
      Bytes[NVar6] = (pSVar8->Icache + lVar5)[NVar6];
      NVar6 = NVar6 + 1;
    } while (Size != NVar6);
  }
  return 0;
}

Assistant:

SHEMU_STATUS
ShemuMemFetch(
    SHEMU_CONTEXT *Context,
    ND_UINT64 Gla,
    ND_UINT64 Size,
    ND_UINT8 *Bytes
    )
{
    ND_UINT8 *addr;
    ND_UINT64 offset;

    if (Size > SHEMU_ICACHE_SIZE || Size == 0)
    {
        return SHEMU_ABORT_INVALID_PARAMETER;
    }

    if (!ShemuIsShellcodePtr(Context, Gla, Size))
    {
        return SHEMU_ABORT_RIP_OUTSIDE;
    }

    addr = Context->Shellcode;
    offset = Gla - Context->ShellcodeBase;

    if (0 != (Context->Options & SHEMU_OPT_DIRECT_MAPPED_SHELL))
    {
        // If the entire address is NOT inside the cache, re-fill the entire line, starting with Gla.
        if (!ShemuIsIcachePtr(Context, Gla, 1) || !ShemuIsIcachePtr(Context, Gla + Size - 1, 1))
        {
            // Re-fill the line.
            Context->Icache.Address = Gla;
            Context->Icache.Size = MIN(SHEMU_ICACHE_SIZE, Context->ShellcodeSize - offset);

            if (Context->Icache.Size < Size)
            {
                return SHEMU_ABORT_RIP_OUTSIDE;
            }

            if ((ND_NULL == Context->AccessShellcode) || 
                !Context->AccessShellcode(Context, Gla, (ND_SIZET)Context->Icache.Size, Context->Icache.Icache, ND_FALSE))
            {
                return SHEMU_ABORT_FETCH_ERROR;
            }
        }

        addr = Context->Icache.Icache;
        offset = Gla - Context->Icache.Address;
    }

    shemu_memcpy(Bytes, addr + offset, (ND_SIZET)Size);

    return SHEMU_SUCCESS;
}